

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O2

void __thiscall FIX::FieldNotFound::FieldNotFound(FieldNotFound *this,int field,string *what)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  std::__cxx11::to_string(&local_40,field);
  std::operator+(&local_60,"Field not found: ",&local_40);
  Exception::Exception(&this->super_Exception,&local_60,what);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&this->super_Exception = &PTR__Exception_0014faa8;
  this->field = field;
  return;
}

Assistant:

FieldNotFound(int field = 0, const std::string &what = "")
      : Exception("Field not found: " + std::to_string(field), what),
        field(field) {}